

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo1.cpp
# Opt level: O1

int256_t * __thiscall primesum::pi_lmo1(int256_t *__return_storage_ptr__,primesum *this,int128_t x)

{
  int128_t *piVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 auVar11 [16];
  ulong uVar12;
  long lVar13;
  int128_t *piVar14;
  long lVar15;
  ulong uVar16;
  long in_RDX;
  ulong extraout_RDX;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  int128_t *piVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int256_t p2;
  vector<int,_std::allocator<int>_> primes;
  vector<int,_std::allocator<int>_> mu;
  vector<int,_std::allocator<int>_> lpf;
  undefined8 in_stack_fffffffffffffeb8;
  long local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  int256_t local_f8;
  int64_t local_d8;
  vector<int,_std::allocator<int>_> local_d0;
  int256_t local_b8;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_80;
  int256_t *local_68;
  long local_60;
  int256_t local_58;
  
  if (-in_RDX < (long)(ulong)((primesum *)0x1 < this)) {
    local_68 = __return_storage_ptr__;
    dVar10 = (double)__floattidf(this);
    dVar10 = pow(dVar10,0.3333333333333333);
    auVar33 = __fixdfti(SUB84(dVar10,0));
    lVar15 = in_RDX;
    if ((long)(ulong)(auVar33._0_8_ == 0) <= auVar33._8_8_) {
      do {
        lVar24 = auVar33._8_8_;
        uVar26 = auVar33._0_8_;
        iVar18 = 2;
        auVar11 = ZEXT816(1);
        do {
          auVar11 = auVar33 * auVar11;
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
        auVar34 = __divti3(this,in_RDX,uVar26,lVar24);
        uVar17 = (ulong)(auVar34._0_8_ < auVar11._0_8_);
        lVar25 = auVar34._8_8_ - auVar11._8_8_;
        lVar15 = in_RDX;
        if ((SBORROW8(auVar34._8_8_,auVar11._8_8_) != SBORROW8(lVar25,uVar17)) ==
            (long)(lVar25 - uVar17) < 0) goto LAB_0011ecdd;
        auVar33._8_8_ = lVar24 + -1 + (ulong)(uVar26 != 0);
        auVar33._0_8_ = uVar26 - 1;
      } while (-lVar24 < (long)(ulong)(1 < uVar26));
      auVar33 = ZEXT816(0);
    }
LAB_0011ecdd:
    do {
      auVar11 = auVar33;
      piVar14 = auVar11._0_8_;
      uVar17 = (long)piVar14 + 1;
      lVar24 = auVar11._8_8_ + (ulong)((int128_t *)0xfffffffffffffffe < piVar14);
      auVar33._8_8_ = lVar24;
      auVar33._0_8_ = uVar17;
      iVar18 = 2;
      lVar25 = 0;
      uVar26 = 1;
      do {
        auVar34._8_8_ = 0;
        auVar34._0_8_ = uVar26;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar17;
        uVar12 = SUB168(auVar34 * auVar6,0);
        lVar25 = lVar25 * uVar17 + uVar26 * lVar24 + SUB168(auVar34 * auVar6,8);
        iVar18 = iVar18 + -1;
        uVar26 = uVar12;
      } while (iVar18 != 0);
      auVar34 = __divti3(this,in_RDX,uVar17,lVar24);
      uVar26 = (ulong)(auVar34._0_8_ < uVar12);
      lVar24 = auVar34._8_8_ - lVar25;
    } while ((SBORROW8(auVar34._8_8_,lVar25) != SBORROW8(lVar24,uVar26)) ==
             (long)(lVar24 - uVar26) < 0);
    local_d8 = pi_legendre((int64_t)piVar14,1);
    lVar24 = 6;
    if ((long)piVar14 < 0xd) {
      lVar24 = (long)*(int *)(PhiTiny::pi + (long)piVar14 * 4);
    }
    generate_primes(&local_d0,(int64_t)piVar14);
    generate_lpf(&local_80,(int64_t)piVar14);
    generate_moebius(&local_98,(int64_t)piVar14);
    if ((long)piVar14 < 1) {
      local_128 = 0;
      local_130 = 0;
      local_118 = 0;
      local_120 = 0;
    }
    else {
      local_118 = 0;
      local_120 = 0;
      local_128 = 0;
      local_130 = 0;
      piVar20 = (int128_t *)0x0;
      do {
        piVar1 = (int128_t *)((long)piVar20 + 1);
        if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar24] <
            local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[(long)piVar20 + 1]) {
          auVar33 = __udivti3(this,lVar15,piVar1,0);
          x_00._8_8_ = lVar15;
          x_00._0_8_ = in_stack_fffffffffffffeb8;
          phi_sum(&local_58,auVar33._0_8_,(int128_t)x_00,auVar33._8_8_);
          local_f8.low._0_8_ =
               (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)piVar20 + 1] * (long)piVar1;
          local_f8.low._8_8_ = (long)(ulong)local_f8.low >> 0x3f;
          local_f8.high._0_8_ = local_f8.low._8_8_;
          local_f8.high._8_8_ = local_f8.low._8_8_;
          int256_t::operator*(&local_b8,&local_58,&local_f8);
          bVar30 = CARRY8(local_128,(ulong)local_b8.high);
          uVar17 = local_128 + (ulong)local_b8.high;
          bVar31 = CARRY8(local_118,(ulong)local_b8.low);
          local_118 = local_118 + (ulong)local_b8.low;
          bVar32 = CARRY8(local_120,local_b8.low._8_8_);
          uVar26 = local_120 + local_b8.low._8_8_;
          local_120 = uVar26 + bVar31;
          uVar26 = (ulong)(bVar32 || CARRY8(uVar26,(ulong)bVar31));
          local_128 = uVar17 + uVar26;
          local_130 = local_130 + local_b8.high._8_8_ + (ulong)bVar30 + (ulong)CARRY8(uVar17,uVar26)
          ;
        }
        piVar20 = piVar1;
      } while (piVar14 != piVar1);
    }
    uVar26 = 0;
    lVar25 = 0;
    local_110 = 0;
    local_108 = 0;
    if (lVar24 + 1 < local_d8) {
      local_110 = 0;
      local_108 = 0;
      uVar26 = 0;
      lVar25 = 0;
      lVar2 = lVar24 + 1;
      do {
        lVar13 = lVar2;
        local_60 = lVar24;
        if ((long)piVar14 /
            (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar13] < (long)piVar14) {
          piVar20 = (int128_t *)
                    ((long)piVar14 /
                     (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar13] + 1);
          lVar24 = (long)piVar20 >> 0x3f;
          do {
            if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar13] <
                local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)piVar20]) {
              uVar17 = (ulong)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar13];
              auVar3._8_8_ = 0;
              auVar3._0_8_ = piVar20;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = uVar17;
              auVar33 = __divti3(this,lVar15,SUB168(auVar3 * auVar7,0),
                                 uVar17 * lVar24 + SUB168(auVar3 * auVar7,8) +
                                 ((long)uVar17 >> 0x3f) * (long)piVar20);
              x_01._8_8_ = lVar15;
              x_01._0_8_ = in_stack_fffffffffffffeb8;
              phi_sum(&local_58,auVar33._0_8_,(int128_t)x_01,auVar33._8_8_);
              uVar12 = (ulong)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[(long)piVar20];
              auVar4._8_8_ = 0;
              auVar4._0_8_ = piVar20;
              auVar8._8_8_ = 0;
              auVar8._0_8_ = uVar12;
              uVar17 = SUB168(auVar4 * auVar8,0);
              uVar19 = (ulong)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar13];
              auVar5._8_8_ = 0;
              auVar5._0_8_ = uVar17;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = uVar19;
              local_f8.low._0_8_ = SUB168(auVar5 * auVar9,0);
              local_f8.low._8_8_ =
                   (uVar12 * lVar24 + SUB168(auVar4 * auVar8,8) +
                   ((long)uVar12 >> 0x3f) * (long)piVar20) * uVar19 +
                   SUB168(auVar5 * auVar9,8) + ((long)uVar19 >> 0x3f) * uVar17;
              local_f8.high._0_8_ = (long)local_f8.low._8_8_ >> 0x3f;
              local_f8.high._8_8_ = (ulong)local_f8.high;
              int256_t::operator*(&local_b8,&local_58,&local_f8);
              bVar30 = uVar26 < (ulong)local_b8.high;
              uVar12 = uVar26 - (ulong)local_b8.high;
              bVar31 = local_110 < (ulong)local_b8.low;
              local_110 = local_110 - (ulong)local_b8.low;
              bVar32 = local_108 < local_b8.low._8_8_;
              uVar26 = local_108 - local_b8.low._8_8_;
              local_108 = uVar26 - bVar31;
              uVar17 = (ulong)(bVar32 || uVar26 < bVar31);
              uVar26 = uVar12 - uVar17;
              lVar25 = ((lVar25 - local_b8.high._8_8_) - (ulong)bVar30) - (ulong)(uVar12 < uVar17);
            }
            bVar30 = (int128_t *)0xfffffffffffffffe < piVar20;
            bVar31 = piVar20 < piVar14;
            bVar32 = SBORROW8(lVar24,(long)piVar14 >> 0x3f);
            lVar2 = lVar24 - ((long)piVar14 >> 0x3f);
            piVar20 = (int128_t *)((long)piVar20 + 1);
            lVar24 = lVar24 + (ulong)bVar30;
          } while ((bVar32 != SBORROW8(lVar2,(ulong)bVar31)) != (long)(lVar2 - (ulong)bVar31) < 0);
        }
        lVar2 = lVar13 + 1;
        lVar24 = lVar13;
      } while (lVar13 + 1 != local_d8);
    }
    uVar21 = local_108 + local_120 + (ulong)CARRY8(local_110,local_118);
    uVar17 = (ulong)(CARRY8(local_108,local_120) ||
                    CARRY8(local_108 + local_120,(ulong)CARRY8(local_110,local_118)));
    uVar27 = uVar26 + local_128 + uVar17;
    x_02._8_8_ = lVar15;
    x_02._0_8_ = in_stack_fffffffffffffeb8;
    P2(&local_f8,this,(int128_t)x_02,lVar15,auVar11._0_4_);
    piVar14 = prime_sum_tiny(piVar14,(int64_t)this);
    __return_storage_ptr__ = local_68;
    uVar16 = (long)extraout_RDX >> 0x3f;
    uVar28 = uVar27 + uVar16;
    lVar15 = (long)piVar14 + local_110 + local_118;
    uVar12 = (ulong)CARRY8((ulong)piVar14,local_110 + local_118);
    uVar19 = uVar21 + extraout_RDX;
    uVar22 = uVar19 + uVar12;
    uVar12 = (ulong)(CARRY8(uVar21,extraout_RDX) || CARRY8(uVar19,uVar12));
    uVar29 = uVar28 + uVar12;
    uVar21 = lVar15 - 1;
    uVar19 = (ulong)(lVar15 == 0);
    uVar23 = uVar22 - uVar19;
    uVar19 = (ulong)(uVar22 < uVar19);
    uVar22 = uVar29 - uVar19;
    lVar24 = uVar22 - (ulong)local_f8.high;
    lVar15 = (((lVar25 + local_130 + (ulong)CARRY8(uVar26,local_128) +
                (ulong)CARRY8(uVar26 + local_128,uVar17) + uVar16 + (ulong)CARRY8(uVar27,uVar16) +
               (ulong)CARRY8(uVar28,uVar12)) - (ulong)(uVar29 < uVar19)) - local_f8.high._8_8_) -
             (ulong)(uVar22 < (ulong)local_f8.high);
    *(undefined8 *)&local_68->high = 0;
    *(undefined8 *)((long)&local_68->high + 8) = 0;
    *(undefined8 *)&local_68->low = 0;
    *(undefined8 *)((long)&local_68->low + 8) = 0;
    uVar26 = (ulong)(uVar21 < (ulong)local_f8.low);
    uVar17 = uVar23 - local_f8.low._8_8_;
    *(long *)&local_68->high = lVar24;
    *(long *)((long)&local_68->high + 8) = lVar15;
    *(ulong *)&local_68->low = uVar21 - (ulong)local_f8.low;
    *(ulong *)((long)&local_68->low + 8) = uVar17 - uVar26;
    if (uVar23 < local_f8.low._8_8_ || uVar17 < uVar26) {
      *(long *)&local_68->high = lVar24 + -1;
      *(ulong *)((long)&local_68->high + 8) = lVar15 + -1 + (ulong)(lVar24 != 0);
    }
    if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    *(undefined8 *)&__return_storage_ptr__->high = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->high + 8) = 0;
    *(undefined8 *)&__return_storage_ptr__->low = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->low + 8) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

int256_t pi_lmo1(int128_t x)
{
  if (x < 2)
    return 0;

  int64_t y = iroot<3>(x); 
  int64_t pi_y = pi_legendre(y, 1);
  int64_t c = PhiTiny::get_c(y);
  int256_t S1 = 0;
  int256_t S2 = 0;

  vector<int32_t> primes = generate_primes(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> mu = generate_moebius(y);

  // Calculate the contribution of the ordinary leaves
  for (int64_t n = 1; n <= y; n++)
    if (lpf[n] > primes[c])
      S1 += phi_sum(x / n, c) * (mu[n] * n);
  
  // Calculate the contribution of the special leaves
  for (int64_t b = c + 1; b < pi_y; b++)
    for (int128_t m = (y / primes[b]) + 1; m <= y; m++)
      if (lpf[m] > primes[b])
        S2 -= phi_sum(x / (primes[b] * m), b - 1) * (mu[m] * m * primes[b]);

  int256_t phi = S1 + S2;
  int256_t p2 = P2(x, y, 1);
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return sum;
}